

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O3

int util::fs::mkdir(char *__path,__mode_t __mode)

{
  int iVar1;
  
  iVar1 = ::mkdir(__path,0x1e8);
  return CONCAT31((int3)((uint)iVar1 >> 8),-1 < iVar1);
}

Assistant:

bool
mkdir (char const* pathname/*, mode_t mode*/)
{
#ifdef _WIN32
    if (::_mkdir(pathname) < 0)
        return false;
#else // _WIN32
    if (::mkdir(pathname, S_IRWXU | S_IRGRP | S_IXGRP) < 0)
        return false;
#endif // _WIN32

  return true;
}